

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.c
# Opt level: O3

int picnic_timingsafe_bcmp(void *a,void *b,size_t len)

{
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  ushort uVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar7 [16];
  
  if (len == 0) {
    return 0;
  }
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  uVar5 = 0;
  auVar13 = vpbroadcastq_avx512f();
  do {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vmovdqa64_avx512f(auVar16);
    auVar16 = vporq_avx512f(auVar14,auVar11);
    auVar14 = vporq_avx512f(auVar14,auVar12);
    uVar2 = vpcmpuq_avx512f(auVar14,auVar13,2);
    bVar3 = (byte)uVar2;
    uVar2 = vpcmpuq_avx512f(auVar16,auVar13,2);
    bVar4 = (byte)uVar2;
    uVar6 = CONCAT11(bVar4,bVar3);
    auVar7 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)a + uVar5));
    auVar8[1] = ((byte)(uVar6 >> 1) & 1) * auVar7[1];
    auVar8[0] = (bVar3 & 1) * auVar7[0];
    auVar8[2] = ((byte)(uVar6 >> 2) & 1) * auVar7[2];
    auVar8[3] = ((byte)(uVar6 >> 3) & 1) * auVar7[3];
    auVar8[4] = ((byte)(uVar6 >> 4) & 1) * auVar7[4];
    auVar8[5] = ((byte)(uVar6 >> 5) & 1) * auVar7[5];
    auVar8[6] = ((byte)(uVar6 >> 6) & 1) * auVar7[6];
    auVar8[7] = ((byte)(uVar6 >> 7) & 1) * auVar7[7];
    auVar8[8] = (bVar4 & 1) * auVar7[8];
    auVar8[9] = (bVar4 >> 1 & 1) * auVar7[9];
    auVar8[10] = (bVar4 >> 2 & 1) * auVar7[10];
    auVar8[0xb] = (bVar4 >> 3 & 1) * auVar7[0xb];
    auVar8[0xc] = (bVar4 >> 4 & 1) * auVar7[0xc];
    auVar8[0xd] = (bVar4 >> 5 & 1) * auVar7[0xd];
    auVar8[0xe] = (bVar4 >> 6 & 1) * auVar7[0xe];
    auVar8[0xf] = -((char)bVar4 >> 7) * auVar7[0xf];
    auVar7 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)b + uVar5));
    auVar9[1] = ((byte)(uVar6 >> 1) & 1) * auVar7[1];
    auVar9[0] = (bVar3 & 1) * auVar7[0];
    auVar9[2] = ((byte)(uVar6 >> 2) & 1) * auVar7[2];
    auVar9[3] = ((byte)(uVar6 >> 3) & 1) * auVar7[3];
    auVar9[4] = ((byte)(uVar6 >> 4) & 1) * auVar7[4];
    auVar9[5] = ((byte)(uVar6 >> 5) & 1) * auVar7[5];
    auVar9[6] = ((byte)(uVar6 >> 6) & 1) * auVar7[6];
    auVar9[7] = ((byte)(uVar6 >> 7) & 1) * auVar7[7];
    auVar9[8] = (bVar4 & 1) * auVar7[8];
    auVar9[9] = (bVar4 >> 1 & 1) * auVar7[9];
    auVar9[10] = (bVar4 >> 2 & 1) * auVar7[10];
    auVar9[0xb] = (bVar4 >> 3 & 1) * auVar7[0xb];
    auVar9[0xc] = (bVar4 >> 4 & 1) * auVar7[0xc];
    auVar9[0xd] = (bVar4 >> 5 & 1) * auVar7[0xd];
    auVar9[0xe] = (bVar4 >> 6 & 1) * auVar7[0xe];
    auVar9[0xf] = -((char)bVar4 >> 7) * auVar7[0xf];
    uVar5 = uVar5 + 0x10;
    auVar16 = vpmovzxbd_avx512f(auVar9 ^ auVar8);
    auVar16 = vpord_avx512f(auVar15,auVar16);
  } while ((len + 0xf & 0xfffffffffffffff0) != uVar5);
  auVar11 = vmovdqa32_avx512f(auVar16);
  auVar12._0_4_ = (uint)(bVar3 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar15._0_4_;
  bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar12._4_4_ = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * auVar15._4_4_;
  bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar12._8_4_ = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * auVar15._8_4_;
  bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar12._12_4_ = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * auVar15._12_4_;
  bVar1 = (bool)((byte)(uVar6 >> 4) & 1);
  auVar12._16_4_ = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * auVar15._16_4_;
  bVar1 = (bool)((byte)(uVar6 >> 5) & 1);
  auVar12._20_4_ = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * auVar15._20_4_;
  bVar1 = (bool)((byte)(uVar6 >> 6) & 1);
  auVar12._24_4_ = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * auVar15._24_4_;
  bVar1 = (bool)((byte)(uVar6 >> 7) & 1);
  auVar12._28_4_ = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * auVar15._28_4_;
  auVar12._32_4_ = (uint)(bVar4 & 1) * auVar11._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar15._32_4_;
  bVar1 = (bool)(bVar4 >> 1 & 1);
  auVar12._36_4_ = (uint)bVar1 * auVar11._36_4_ | (uint)!bVar1 * auVar15._36_4_;
  bVar1 = (bool)(bVar4 >> 2 & 1);
  auVar12._40_4_ = (uint)bVar1 * auVar11._40_4_ | (uint)!bVar1 * auVar15._40_4_;
  bVar1 = (bool)(bVar4 >> 3 & 1);
  auVar12._44_4_ = (uint)bVar1 * auVar11._44_4_ | (uint)!bVar1 * auVar15._44_4_;
  bVar1 = (bool)(bVar4 >> 4 & 1);
  auVar12._48_4_ = (uint)bVar1 * auVar11._48_4_ | (uint)!bVar1 * auVar15._48_4_;
  bVar1 = (bool)(bVar4 >> 5 & 1);
  auVar12._52_4_ = (uint)bVar1 * auVar11._52_4_ | (uint)!bVar1 * auVar15._52_4_;
  bVar1 = (bool)(bVar4 >> 6 & 1);
  auVar12._56_4_ = (uint)bVar1 * auVar11._56_4_ | (uint)!bVar1 * auVar15._56_4_;
  auVar12._60_4_ = (uint)(bVar4 >> 7) * auVar11._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar15._60_4_;
  auVar10 = vextracti64x4_avx512f(auVar12,1);
  auVar11 = vpord_avx512f(auVar12,ZEXT3264(auVar10));
  auVar7 = vpor_avx(auVar11._0_16_,auVar11._16_16_);
  auVar8 = vpshufd_avx(auVar7,0xee);
  auVar7 = vpor_avx(auVar7,auVar8);
  auVar8 = vpshufd_avx(auVar7,0x55);
  auVar7 = vpor_avx(auVar7,auVar8);
  return auVar7._0_4_;
}

Assistant:

int picnic_timingsafe_bcmp(const void* a, const void* b, size_t len) {
#if defined(HAVE_CONSTTIME_MEMEQUAL)
  return !consttime_memequal(a, b, len);
#else
  const unsigned char* p1 = a;
  const unsigned char* p2 = b;

  unsigned int res = 0;
  for (; len; --len, ++p1, ++p2) {
    res |= *p1 ^ *p2;
  }
  return res;
#endif
}